

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

void Acec_BoxFree(Acec_Box_t *pBox)

{
  Vec_Wec_t *pVVar1;
  void *pvVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  long lVar6;
  
  pVVar1 = pBox->vAdds;
  if (pVVar1 != (Vec_Wec_t *)0x0) {
    iVar3 = pVVar1->nCap;
    pVVar4 = pVVar1->pArray;
    if (iVar3 < 1) {
      if (pVVar4 != (Vec_Int_t *)0x0) goto LAB_0067f1ca;
    }
    else {
      lVar6 = 8;
      lVar5 = 0;
      do {
        pvVar2 = *(void **)((long)&pVVar4->nCap + lVar6);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
          pVVar4 = pVVar1->pArray;
          *(undefined8 *)((long)&pVVar4->nCap + lVar6) = 0;
          iVar3 = pVVar1->nCap;
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar5 < iVar3);
LAB_0067f1ca:
      free(pVVar4);
    }
    free(pVVar1);
    pBox->vAdds = (Vec_Wec_t *)0x0;
  }
  pVVar1 = pBox->vLeafLits;
  if (pVVar1 != (Vec_Wec_t *)0x0) {
    iVar3 = pVVar1->nCap;
    pVVar4 = pVVar1->pArray;
    if (iVar3 < 1) {
      if (pVVar4 != (Vec_Int_t *)0x0) goto LAB_0067f232;
    }
    else {
      lVar6 = 8;
      lVar5 = 0;
      do {
        pvVar2 = *(void **)((long)&pVVar4->nCap + lVar6);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
          pVVar4 = pVVar1->pArray;
          *(undefined8 *)((long)&pVVar4->nCap + lVar6) = 0;
          iVar3 = pVVar1->nCap;
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar5 < iVar3);
LAB_0067f232:
      free(pVVar4);
    }
    free(pVVar1);
    pBox->vLeafLits = (Vec_Wec_t *)0x0;
  }
  pVVar1 = pBox->vRootLits;
  if (pVVar1 != (Vec_Wec_t *)0x0) {
    iVar3 = pVVar1->nCap;
    pVVar4 = pVVar1->pArray;
    if (iVar3 < 1) {
      if (pVVar4 != (Vec_Int_t *)0x0) goto LAB_0067f29a;
    }
    else {
      lVar6 = 8;
      lVar5 = 0;
      do {
        pvVar2 = *(void **)((long)&pVVar4->nCap + lVar6);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
          pVVar4 = pVVar1->pArray;
          *(undefined8 *)((long)&pVVar4->nCap + lVar6) = 0;
          iVar3 = pVVar1->nCap;
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar5 < iVar3);
LAB_0067f29a:
      free(pVVar4);
    }
    free(pVVar1);
    pBox->vRootLits = (Vec_Wec_t *)0x0;
  }
  pVVar1 = pBox->vUnique;
  if (pVVar1 != (Vec_Wec_t *)0x0) {
    iVar3 = pVVar1->nCap;
    pVVar4 = pVVar1->pArray;
    if (iVar3 < 1) {
      if (pVVar4 != (Vec_Int_t *)0x0) goto LAB_0067f302;
    }
    else {
      lVar6 = 8;
      lVar5 = 0;
      do {
        pvVar2 = *(void **)((long)&pVVar4->nCap + lVar6);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
          pVVar4 = pVVar1->pArray;
          *(undefined8 *)((long)&pVVar4->nCap + lVar6) = 0;
          iVar3 = pVVar1->nCap;
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar5 < iVar3);
LAB_0067f302:
      free(pVVar4);
    }
    free(pVVar1);
    pBox->vUnique = (Vec_Wec_t *)0x0;
  }
  pVVar1 = pBox->vShared;
  if (pVVar1 == (Vec_Wec_t *)0x0) goto LAB_0067f377;
  iVar3 = pVVar1->nCap;
  pVVar4 = pVVar1->pArray;
  if (iVar3 < 1) {
    if (pVVar4 != (Vec_Int_t *)0x0) goto LAB_0067f36a;
  }
  else {
    lVar6 = 8;
    lVar5 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar4->nCap + lVar6);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        pVVar4 = pVVar1->pArray;
        *(undefined8 *)((long)&pVVar4->nCap + lVar6) = 0;
        iVar3 = pVVar1->nCap;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < iVar3);
LAB_0067f36a:
    free(pVVar4);
  }
  free(pVVar1);
LAB_0067f377:
  free(pBox);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Acec_BoxFree( Acec_Box_t * pBox )
{
    Vec_WecFreeP( &pBox->vAdds );
    Vec_WecFreeP( &pBox->vLeafLits );
    Vec_WecFreeP( &pBox->vRootLits );
    Vec_WecFreeP( &pBox->vUnique );
    Vec_WecFreeP( &pBox->vShared );
    ABC_FREE( pBox );
}